

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::UninterpretedOption::SerializeWithCachedSizes
          (UninterpretedOption *this,CodedOutputStream *output)

{
  int iVar1;
  uint uVar2;
  string *psVar3;
  Type *value;
  UnknownFieldSet *unknown_fields;
  int index;
  
  iVar1 = (this->name_).super_RepeatedPtrFieldBase.current_size_;
  for (index = 0; iVar1 != index; index = index + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
                      (&(this->name_).super_RepeatedPtrFieldBase,index);
    internal::WireFormatLite::WriteMessageMaybeToArray(2,(MessageLite *)value,output);
  }
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 1) != 0) {
    psVar3 = (this->identifier_value_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "google.protobuf.UninterpretedOption.identifier_value");
    internal::WireFormatLite::WriteStringMaybeAliased(3,(this->identifier_value_).ptr_,output);
  }
  if ((uVar2 & 8) != 0) {
    internal::WireFormatLite::WriteUInt64(4,this->positive_int_value_,output);
  }
  if ((uVar2 & 0x10) != 0) {
    internal::WireFormatLite::WriteInt64(5,this->negative_int_value_,output);
  }
  if ((uVar2 & 0x20) != 0) {
    internal::WireFormatLite::WriteDouble(6,this->double_value_,output);
  }
  if ((uVar2 & 2) != 0) {
    internal::WireFormatLite::WriteBytesMaybeAliased(7,(this->string_value_).ptr_,output);
  }
  if ((uVar2 & 4) != 0) {
    psVar3 = (this->aggregate_value_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "google.protobuf.UninterpretedOption.aggregate_value");
    internal::WireFormatLite::WriteStringMaybeAliased(8,(this->aggregate_value_).ptr_,output);
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return;
  }
  unknown_fields = UninterpretedOption::unknown_fields(this);
  internal::WireFormat::SerializeUnknownFields(unknown_fields,output);
  return;
}

Assistant:

void UninterpretedOption::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:google.protobuf.UninterpretedOption)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
  for (unsigned int i = 0, n = this->name_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      2, this->name(i), output);
  }

  cached_has_bits = _has_bits_[0];
  // optional string identifier_value = 3;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->identifier_value().data(), this->identifier_value().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.UninterpretedOption.identifier_value");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      3, this->identifier_value(), output);
  }

  // optional uint64 positive_int_value = 4;
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(4, this->positive_int_value(), output);
  }

  // optional int64 negative_int_value = 5;
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(5, this->negative_int_value(), output);
  }

  // optional double double_value = 6;
  if (cached_has_bits & 0x00000020u) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(6, this->double_value(), output);
  }

  // optional bytes string_value = 7;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(
      7, this->string_value(), output);
  }

  // optional string aggregate_value = 8;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->aggregate_value().data(), this->aggregate_value().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.UninterpretedOption.aggregate_value");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      8, this->aggregate_value(), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:google.protobuf.UninterpretedOption)
}